

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ofstream *this;
  ostream *poVar3;
  VariableList *pVVar4;
  char *pcVar5;
  bool bVar6;
  allocator local_65;
  int local_64;
  char **local_60;
  int local_58;
  int OptionIndex;
  value_type local_50;
  
  CompileFlag = 0;
  OutFile = (ostream *)&std::cout;
  KeepAllLines = 0;
  local_64 = argc;
  local_60 = argv;
  initialize_node_type();
  iVar2 = 0;
  do {
    iVar1 = getopt_long(local_64,local_60,"t:T:vVcCpPo:O:hHliI:",OptionListLong,&OptionIndex);
    switch(iVar1) {
    case 0x43:
switchD_00103849_caseD_63:
      CompileFlag = 1;
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x55:
      goto switchD_00103849_caseD_64;
    case 0x48:
switchD_00103849_caseD_68:
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Usage: basic [-h] [-t<n>] [-v] [-c] [-p] [-l] [-I <path>] [-o <file>] <source>"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "   or: basic [--help] [--trace <n>] [--varlist] ");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(poVar3,
                               "       [--include <path>] [--compile] [--position] [--lines] [--output <file>] <source>"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = 1;
      break;
    case 0x49:
      local_58 = iVar2;
      std::__cxx11::string::string((string *)&local_50,(char *)_optarg,&local_65);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&include_abi_cxx11_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      iVar2 = local_58;
      break;
    case 0x4c:
switchD_00103849_caseD_6c:
      KeepAllLines = 1;
      break;
    case 0x4f:
switchD_00103849_caseD_6f:
      if (OutFile != (ostream *)&std::cout) {
        if (OutFile != (ostream *)0x0) {
          (**(code **)(*(long *)OutFile + 8))();
        }
        OutFile = (ostream *)0x0;
      }
      this = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(this,(char *)_optarg,_S_out);
      OutFile = (ostream *)this;
      break;
    case 0x50:
switchD_00103849_caseD_70:
      PositionDump = 1;
      break;
    case 0x54:
switchD_00103849_caseD_74:
      if ((*_optarg & 1) != 0) {
        DebugDump = 1;
      }
      if ((*_optarg & 2) != 0) {
        DebugDumpOne = 1;
      }
      break;
    case 0x56:
switchD_00103849_caseD_76:
      VariableDump = 1;
      break;
    default:
      switch(iVar1) {
      case 99:
        goto switchD_00103849_caseD_63;
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x75:
        goto switchD_00103849_caseD_64;
      case 0x68:
        goto switchD_00103849_caseD_68;
      case 0x69:
        DefaultType = VARTYPE_LONG;
        break;
      case 0x6c:
        goto switchD_00103849_caseD_6c;
      case 0x6f:
        goto switchD_00103849_caseD_6f;
      case 0x70:
        goto switchD_00103849_caseD_70;
      case 0x74:
        goto switchD_00103849_caseD_74;
      case 0x76:
        goto switchD_00103849_caseD_76;
      default:
        if (iVar1 == -1) {
          bVar6 = iVar2 == 0;
          goto LAB_001039fb;
        }
        goto switchD_00103849_caseD_64;
      }
    }
  } while( true );
LAB_001039fb:
  if (local_64 <= _optind) goto LAB_00103ae1;
  include_stack_pointer = 0;
  xline = 1;
  yyin = (FILE *)fopen(local_60[_optind],"r");
  if ((FILE *)yyin == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open input file ");
    pcVar5 = local_60[_optind];
    goto LAB_00103be3;
  }
  WriteHeader(OutFile,local_60[_optind]);
  if (PositionDump != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Parsing.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  pVVar4 = (VariableList *)operator_new(0x20);
  VariableList::VariableList(pVVar4);
  IntegerType = 10;
  RealType = VARTYPE_DOUBLE;
  Variables = pVVar4;
  iVar2 = yyparse();
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"%Failure during parse");
    std::endl<char,std::char_traits<char>>(poVar3);
    pVVar4 = Variables;
    if (Variables != (VariableList *)0x0) {
      std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::~vector
                (&Variables->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>);
    }
    operator_delete(pVVar4,0x20);
    fclose((FILE *)yyin);
    goto LAB_00103c35;
  }
  fclose((FILE *)yyin);
  pVVar4 = Variables;
  if (Variables != (VariableList *)0x0) {
    std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::~vector
              (&Variables->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>);
  }
  operator_delete(pVVar4,0x20);
  _optind = _optind + 1;
  bVar6 = false;
  goto LAB_001039fb;
switchD_00103849_caseD_64:
  poVar3 = (ostream *)&std::cerr;
  pcVar5 = "%Error on command line \'-h\' for help";
LAB_00103be3:
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00103c35:
  exit(1);
LAB_00103ae1:
  if (bVar6) {
    xline = 1;
    include_stack_pointer = 0;
    yyin = _stdin;
    WriteHeader(OutFile,"Standard Input");
    if (PositionDump != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Parsing.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    pVVar4 = (VariableList *)operator_new(0x20);
    VariableList::VariableList(pVVar4);
    Variables = pVVar4;
    iVar2 = yyparse();
    pVVar4 = Variables;
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"%Failure during parse");
      std::endl<char,std::char_traits<char>>(poVar3);
      pVVar4 = Variables;
      if (Variables != (VariableList *)0x0) {
        std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::~vector
                  (&Variables->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>);
      }
      operator_delete(pVVar4,0x20);
      goto LAB_00103c35;
    }
    if (Variables != (VariableList *)0x0) {
      std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::~vector
                (&Variables->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>);
    }
    operator_delete(pVVar4,0x20);
  }
  if (OutFile != (ostream *)0x0 && OutFile != (ostream *)&std::cout) {
    (**(code **)(*(long *)OutFile + 8))();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	//
	// Local Variables
	//
	int DidOneFlag = 0;
	int OptionSelected;
	int OptionIndex;
	int TestValue;

	//
	// Initialize variables
	//
	OutFile = &std::cout;
	CompileFlag = 0;
	KeepAllLines = false;

	initialize_node_type();

	//
	// Handle input arguments
	//
#ifdef USE_LONGOPT
	while ((OptionSelected = getopt_long(argc, argv, OptionList,
		OptionListLong, &OptionIndex)) != -1)
#else
	while ((OptionSelected = getopt(argc, argv, OptionList)) != -1)
#endif
	{
		//
		// Process one arguement
		//
		switch (OptionSelected)
		{
		case 't':
		case 'T':
			//
			// Tracing
			//
			TestValue = optarg[0] - '0';
			if (TestValue & 1)
			{
				DebugDump = true;
			}
			if (TestValue & 2)
			{
				DebugDumpOne = true;
			}
			break;

		case 'v':
		case 'V':
			//
			// Variable dump(s)
			//
			VariableDump = true;
			break;

		case 'o':
		case 'O':
			//
			// Output File
			//
			if (OutFile != &std::cout)
			{
				delete OutFile;
				OutFile = (std::ostream*)NULL;
			}

			OutFile = new std::ofstream(optarg);
			if (OutFile == (std::ostream*)NULL)
			{
				std::cerr << "Unable to open " << optarg <<
					"for output" << std::endl;
				exit(1);
			}

			break;

		case 'h':
		case 'H':
			DidOneFlag = 1;
			std::cerr << "Usage: basic [-h] [-t<n>] [-v] [-c] [-p] [-l] "
				"[-I <path>] [-o <file>] <source>" << std::endl;
			std::cerr << "   or: basic [--help] [--trace <n>] [--varlist] " << std::endl <<
			"       [--include <path>] [--compile] [--position] [--lines] [--output <file>] <source>" << std::endl;

			break;

		case 'c':
		case 'C':
			CompileFlag = 1;
			break;

		case 'p':
		case 'P':
			PositionDump = true;
			break;

		case 'l':
		case 'L':
			KeepAllLines = true;
			break;

		case 'i':
			DefaultType = VARTYPE_LONG;
			break;

		case 'I':
			include.push_back(optarg);
			break;

		default:
			std::cerr << "%Error on command line '-h' for help" << std::endl;
			exit(EXIT_FAILURE);
		}
	}

	//
	// Anything left over is files names to process
	//
	while (optind < argc)
	{
		//
		// At least one file name on command line
		//
		DidOneFlag = 1;

		//
		// Reset line counter
		//
		xline = 1;
		include_stack_pointer = 0;

		//
		// Open up source file
		//
		if ((yyin = fopen(argv[optind], "r")) == 0)
		{
			std::cerr << "Unable to open input file " <<
				argv[optind] << std::endl;
			exit(1);
		}

		WriteHeader(*OutFile, argv[optind]);

		//
		// Step 1. Parse the program. YACC will call the
		//  rest of the program if it scans correctly.
		//
		if (PositionDump)
		{
			std::cerr << "Parsing." << std::endl;
		}

		Variables = new VariableList;

		//
		// Default variable sizes
		//
		IntegerType = VARTYPE_LONG;
		RealType = VARTYPE_DOUBLE;

		if (yyparse() != 0)
		{
			std::cerr << "%Failure during parse" << std::endl;
			delete Variables;
			fclose(yyin);
			exit(1);
		}

		//
		// Close the input file
		//
		fclose(yyin);
		delete Variables;

		optind++;
	}

	//
	// If we haven't seen any file names, then get input
	// from the users terminal
	//
	if (DidOneFlag == 0)
	{
		//
		// Reset line counter
		//
		xline = 1;
		include_stack_pointer = 0;

		//
		// Read from standard input if we haven't handled
		// any input files yet.
		//
		yyin = stdin;

		WriteHeader(*OutFile, "Standard Input");

		if (PositionDump)
		{
			std::cerr << "Parsing." << std::endl;
		}

		Variables = new VariableList;

		if (yyparse() != 0)
		{
			std::cerr << "%Failure during parse" << std::endl;
			delete Variables;
			exit(1);
		}

		//
		// Close the input file
		//
		delete Variables;
	}

	if (OutFile != &std::cout)
	{
		delete OutFile;
	}

	return 0;
}